

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MutexFactory.cpp
# Opt level: O1

Mutex * __thiscall MutexFactory::getMutex(MutexFactory *this)

{
  Mutex *pMVar1;
  MutexFactory *pMVar2;
  CK_RV CVar3;
  bool bVar4;
  
  pMVar1 = (Mutex *)operator_new(0x18);
  pMVar1->_vptr_Mutex = (_func_int **)&PTR__Mutex_00150390;
  pMVar2 = i();
  bVar4 = true;
  if (pMVar2->enabled == true) {
    CVar3 = (*pMVar2->createMutex)(&pMVar1->handle);
    bVar4 = CVar3 == 0;
  }
  pMVar1->isValid = bVar4;
  return pMVar1;
}

Assistant:

Mutex* MutexFactory::getMutex()
{
	return new Mutex();
}